

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::do_binary_op
          (value *__return_storage_ptr__,impl *this,token_type op,value *l,value *r)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  wostream *pwVar8;
  bool bVar9;
  double r_00;
  double dVar10;
  double dVar11;
  double r_01;
  double local_1e8;
  string rs;
  wstring_view local_1b8;
  wostringstream _woss;
  
  if (op < minus) {
    if ((0xc0006000UL >> ((ulong)op & 0x3f) & 1) != 0) {
      to_primitive((value *)&_woss,l,number);
      value::operator=(l,(value *)&_woss);
      value::~value((value *)&_woss);
      to_primitive((value *)&_woss,r,number);
      value::operator=(r,(value *)&_woss);
      value::~value((value *)&_woss);
      if ((l->type_ == string) && (r->type_ == string)) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
        pwVar8 = std::operator<<((wostream *)&_woss,"Not implemented: ");
        mjs::operator<<(pwVar8,op);
        std::__cxx11::wstringbuf::str();
        local_1b8._M_len = rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_;
        local_1b8._M_str =
             (wchar_t *)rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
        throw_runtime_error(&local_1b8,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                            ,0x2ce);
      }
      r_00 = to_number(l);
      dVar10 = to_number(r);
      dVar11 = dVar10;
      r_01 = r_00;
      if ((op != ltequal) && (dVar11 = r_00, r_01 = dVar10, op != gtequal)) {
        dVar11 = dVar10;
        if ((op != gt) && (dVar11 = r_00, r_00 = dVar10, op != lt)) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
          pwVar8 = std::operator<<((wostream *)&_woss,"Not implemented: ");
          mjs::operator<<(pwVar8,op);
          std::__cxx11::wstringbuf::str();
          local_1b8._M_len = rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_;
          local_1b8._M_str =
               (wchar_t *)rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
          throw_runtime_error(&local_1b8,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                              ,0x2e0);
        }
        iVar2 = tri_compare(dVar11,r_00);
        __return_storage_ptr__->type_ = boolean;
        (__return_storage_ptr__->field_1).b_ = iVar2 - 1U < 0xfffffffe;
        return __return_storage_ptr__;
      }
      iVar2 = tri_compare(dVar11,r_01);
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).b_ = (iVar2 + 1U & 0xfffffffd) != 0;
      return __return_storage_ptr__;
    }
    if ((ulong)op == 0x26) {
      to_primitive((value *)&_woss,l,undefined);
      value::operator=(l,(value *)&_woss);
      value::~value((value *)&_woss);
      to_primitive((value *)&_woss,r,undefined);
      value::operator=(r,(value *)&_woss);
      value::~value((value *)&_woss);
      if ((l->type_ == string) || (r->type_ == string)) {
        to_string((mjs *)&_woss,this->heap_,l);
        to_string((mjs *)&rs,this->heap_,r);
        operator+((mjs *)&local_1b8,(string *)&_woss,&rs);
        value::value(__return_storage_ptr__,(string *)&local_1b8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1b8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&rs);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&_woss);
        return __return_storage_ptr__;
      }
      local_1e8 = to_number(l);
      dVar11 = to_number(r);
      goto switchD_0013c8b4_caseD_26;
    }
  }
  if (op - equalequal < 2) {
    bVar9 = op != equalequal;
    bVar1 = compare_equal(l,r);
LAB_0013c80d:
    __return_storage_ptr__->type_ = boolean;
    (__return_storage_ptr__->field_1).field5[0] = bVar1 ^ bVar9;
    return __return_storage_ptr__;
  }
  if (op - equalequalequal < 2) {
    bVar9 = op != equalequalequal;
    bVar1 = compare_strict_equal(l,r);
    goto LAB_0013c80d;
  }
  local_1e8 = to_number(l);
  dVar11 = to_number(r);
  switch(op) {
  case plus:
switchD_0013c8b4_caseD_26:
    __return_storage_ptr__->type_ = number;
    (__return_storage_ptr__->field_1).n_ = dVar11 + local_1e8;
    return __return_storage_ptr__;
  case minus:
    local_1e8 = local_1e8 - dVar11;
    break;
  case multiply:
    local_1e8 = local_1e8 * dVar11;
    break;
  case divide:
    local_1e8 = local_1e8 / dVar11;
    break;
  case and_:
    uVar6 = to_int32(local_1e8);
    uVar7 = to_int32(dVar11);
    uVar7 = uVar7 & uVar6;
    goto LAB_0013c9ca;
  case or_:
    uVar6 = to_int32(local_1e8);
    uVar7 = to_int32(dVar11);
    uVar7 = uVar7 | uVar6;
    goto LAB_0013c9ca;
  case xor_:
    uVar6 = to_int32(local_1e8);
    uVar7 = to_int32(dVar11);
    uVar7 = uVar7 ^ uVar6;
LAB_0013c9ca:
    local_1e8 = (double)(int)uVar7;
    break;
  case mod:
    local_1e8 = fmod(local_1e8,dVar11);
    break;
  default:
    if (op == rshiftshift) {
      uVar4 = to_uint32(local_1e8);
      uVar5 = to_uint32(dVar11);
      local_1e8 = (double)(uVar4 >> ((byte)uVar5 & 0x1f));
    }
    else {
      if (op == lshift) {
        iVar3 = to_int32(local_1e8);
        uVar4 = to_uint32(dVar11);
        iVar2 = iVar3 << ((byte)uVar4 & 0x1f);
      }
      else {
        if (op != rshift) {
          std::__cxx11::wostringstream::wostringstream((wostringstream *)&_woss);
          pwVar8 = std::operator<<((wostream *)&_woss,"Not implemented: ");
          mjs::operator<<(pwVar8,op);
          std::__cxx11::wstringbuf::str();
          local_1b8._M_len = rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_;
          local_1b8._M_str =
               (wchar_t *)rs.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
          throw_runtime_error(&local_1b8,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                              ,0x2f8);
        }
        iVar3 = to_int32(local_1e8);
        uVar4 = to_uint32(dVar11);
        iVar2 = iVar3 >> ((byte)uVar4 & 0x1f);
      }
      local_1e8 = (double)iVar2;
    }
  }
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = local_1e8;
  return __return_storage_ptr__;
}

Assistant:

value do_binary_op(const token_type op, value& l, value& r) {
        if (op == token_type::plus) {
            l = to_primitive(l);
            r = to_primitive(r);
            if (l.type() == value_type::string || r.type() == value_type::string) {
                auto ls = to_string(heap_, l);
                auto rs = to_string(heap_, r);
                return value{ls + rs};
            }
            // Otherwise handle like the other operators
        } else if (is_relational(op)) {
            l = to_primitive(l, value_type::number);
            r = to_primitive(r, value_type::number);
            if (l.type() == value_type::string && r.type() == value_type::string) {
                // TODO: See §11.8.5 step 16-21
                NOT_IMPLEMENTED(op);
            }
            const auto ln = to_number(l);
            const auto rn = to_number(r);
            int res;
            switch (op) {
            case token_type::lt:
                res = tri_compare(ln, rn);
                return value{res == -1 ? false : static_cast<bool>(res)};
            case token_type::ltequal:
                res = tri_compare(rn, ln);
                return value{res == -1 || res == 1 ? false : true};
            case token_type::gt:
                res = tri_compare(rn, ln);
                return value{res == -1 ? false : static_cast<bool>(res)};
            case token_type::gtequal:
                res = tri_compare(ln, rn);
                return value{res == -1 || res == 1 ? false : true};
            default: NOT_IMPLEMENTED(op);
            }
        } else if (op == token_type::equalequal || op == token_type::notequal) {
            const bool eq = compare_equal(l ,r);
            return value{op == token_type::equalequal ? eq : !eq};
        } else if (op == token_type::equalequalequal || op == token_type::notequalequal) {
            const bool eq = compare_strict_equal(l ,r);
            return value{op == token_type::equalequalequal ? eq : !eq};
        }

        const auto ln = to_number(l);
        const auto rn = to_number(r);
        switch (op) {
        case token_type::plus:         return value{ln + rn};
        case token_type::minus:        return value{ln - rn};
        case token_type::multiply:     return value{ln * rn};
        case token_type::divide:       return value{ln / rn};
        case token_type::mod:          return value{std::fmod(ln, rn)};
        case token_type::lshift:       return value{static_cast<double>(to_int32(ln) << (to_uint32(rn) & 0x1f))};
        case token_type::rshift:       return value{static_cast<double>(to_int32(ln) >> (to_uint32(rn) & 0x1f))};
        case token_type::rshiftshift:  return value{static_cast<double>(to_uint32(ln) >> (to_uint32(rn) & 0x1f))};
        case token_type::and_:         return value{static_cast<double>(to_int32(ln) & to_int32(rn))};
        case token_type::xor_:         return value{static_cast<double>(to_int32(ln) ^ to_int32(rn))};
        case token_type::or_:          return value{static_cast<double>(to_int32(ln) | to_int32(rn))};
        default: NOT_IMPLEMENTED(op);
        }
    }